

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsProtocol.cpp
# Opt level: O1

void xs::Message::writeHeader(MessageType type,size_t messageSize,deUint8 *dst,size_t bufSize)

{
  Error *this;
  uint uVar1;
  
  if (7 < bufSize) {
    uVar1 = (uint)messageSize;
    *(uint *)dst = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    *(MessageType *)(dst + 4) =
         type >> 0x18 | (type & 0xff0000) >> 8 | (type & 0xff00) << 8 | type << 0x18;
    return;
  }
  this = (Error *)__cxa_allocate_exception(0x10);
  Error::Error(this,"Incomplete header","bufSize >= MESSAGE_HEADER_SIZE",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/execserver/xsProtocol.cpp"
               ,0x97);
  __cxa_throw(this,&Error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Message::writeHeader (MessageType type, size_t messageSize, deUint8* dst, size_t bufSize)
{
	XS_CHECK_MSG(bufSize >= MESSAGE_HEADER_SIZE, "Incomplete header");
	int netSize = hostToNetwork((int)messageSize);
	int netType = hostToNetwork((int)type);
	deMemcpy(dst+0, &netSize, sizeof(netSize));
	deMemcpy(dst+4, &netType, sizeof(netType));
}